

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  unsigned_long_long uVar4;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x104f,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  if (aes == (ContentEncAESSettings *)0x0) {
    __assert_fail("aes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1050,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  stop = size + start;
  pos = start;
  do {
    if (stop <= pos) {
      return 0;
    }
    lVar3 = ParseElementHeader(pReader,&pos,stop,&id,&size_1);
    lVar2 = size_1;
    lVar1 = pos;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (id == 0x47e8) {
      uVar4 = UnserializeUInt(pReader,pos,size_1);
      aes->cipher_mode = uVar4;
      if (uVar4 != 1) {
        return -2;
      }
    }
    pos = lVar1 + lVar2;
  } while (pos <= stop);
  return -2;
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}